

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CatalogReader.hpp
# Opt level: O3

CourseComponent * __thiscall CatalogReader::constructCourse(CatalogReader *this,ifstream *fin)

{
  char cVar1;
  char cVar2;
  int numUnits;
  ostream *poVar3;
  long *plVar4;
  Course *this_00;
  pointer pbVar5;
  undefined8 uVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  string courseName;
  string prerequisites;
  string courseTitle;
  string combined;
  string courseDescription;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1f8;
  char *local_1d8;
  long local_1d0;
  char local_1c8 [16];
  char *local_1b8;
  long local_1b0;
  char local_1a8 [16];
  string local_198;
  undefined1 *local_178;
  long local_170;
  undefined1 local_168 [16];
  char *local_158;
  long local_150;
  char local_148 [16];
  undefined1 local_138 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  undefined1 local_f8 [24];
  long lStack_e0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_1d8 = local_1c8;
  local_1d0 = 0;
  local_1c8[0] = '\0';
  local_158 = local_148;
  local_150 = 0;
  local_148[0] = '\0';
  local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
  local_198._M_string_length = 0;
  local_198.field_2._M_local_buf[0] = '\0';
  local_1b8 = local_1a8;
  local_1b0 = 0;
  local_1a8[0] = '\0';
  local_178 = local_168;
  local_170 = 0;
  local_168[0] = 0;
  local_1f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  cVar2 = (char)fin;
  cVar1 = std::ios::widen((char)*(undefined8 *)(*(long *)fin + -0x18) + cVar2);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)fin,(string *)&local_1d8,cVar1);
  cVar1 = std::ios::widen((char)*(undefined8 *)(*(long *)fin + -0x18) + cVar2);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)fin,(string *)&local_198,cVar1);
  cVar1 = std::ios::widen((char)*(undefined8 *)(*(long *)fin + -0x18) + cVar2);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)fin,(string *)&local_1b8,cVar1);
  cVar1 = std::ios::widen((char)*(undefined8 *)(*(long *)fin + -0x18) + cVar2);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)fin,(string *)&local_158,cVar1);
  if (this->debugOn == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"--- FILE TEXT ---",0x11);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    std::ostream::flush();
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_1d8,local_1d0);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    poVar3 = (ostream *)std::ostream::flush();
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,local_198._M_dataplus._M_p,local_198._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    poVar3 = (ostream *)std::ostream::flush();
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_1b8,local_1b0);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    poVar3 = (ostream *)std::ostream::flush();
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_158,local_150);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"-----------------",0x11);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    std::ostream::flush();
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_50,local_1b8,local_1b8 + local_1b0);
  getPrereqs((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_138,this,&local_50);
  local_f8._16_8_ =
       local_1f8.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_f8._8_8_ =
       local_1f8.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_f8._0_8_ =
       local_1f8.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_1f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_138._16_8_;
  local_1f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_138._0_8_;
  local_1f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_138._8_8_;
  local_138._0_8_ = (pointer)0x0;
  local_138._8_8_ = (pointer)0x0;
  local_138._16_8_ = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_f8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  numUnits = getCourseUnits(this,&local_198);
  local_138._0_8_ = (pointer)(local_138 + 0x10);
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_138,local_198._M_dataplus._M_p,
             local_198._M_dataplus._M_p + local_198._M_string_length);
  std::__cxx11::string::append(local_138);
  plVar4 = (long *)std::__cxx11::string::_M_append(local_138,(ulong)local_158);
  pbVar5 = (pointer)(plVar4 + 2);
  if ((pointer)*plVar4 == pbVar5) {
    local_f8._16_8_ = (pbVar5->_M_dataplus)._M_p;
    lStack_e0 = plVar4[3];
    local_f8._0_8_ = (pointer)(local_f8 + 0x10);
  }
  else {
    local_f8._16_8_ = (pbVar5->_M_dataplus)._M_p;
    local_f8._0_8_ = (pointer)*plVar4;
  }
  local_f8._8_8_ = plVar4[1];
  *plVar4 = (long)pbVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::string::operator=((string *)&local_178,(string *)local_f8);
  if ((pointer)local_f8._0_8_ != (pointer)(local_f8 + 0x10)) {
    operator_delete((void *)local_f8._0_8_);
  }
  if ((pointer)local_138._0_8_ != (pointer)(local_138 + 0x10)) {
    operator_delete((void *)local_138._0_8_);
  }
  if (local_1f8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_1f8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    this_00 = (Course *)operator_new(0x68);
    paVar7 = &local_70.field_2;
    local_70._M_dataplus._M_p = (pointer)paVar7;
    std::__cxx11::string::_M_construct<char*>((string *)&local_70,local_1d8,local_1d8 + local_1d0);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_90,local_178,local_178 + local_170);
    Prerequisite::Prerequisite((Prerequisite *)this_00,&local_70,numUnits,&local_90);
    uVar6 = local_70._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
      uVar6 = local_70._M_dataplus._M_p;
    }
  }
  else {
    this_00 = (Course *)operator_new(0x88);
    local_118._M_allocated_capacity = (size_type)&local_108;
    std::__cxx11::string::_M_construct<char*>((string *)&local_118,local_1d8,local_1d8 + local_1d0);
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_b0,local_178,local_178 + local_170);
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_d0,local_1b8,local_1b8 + local_1b0);
    Course::Course(this_00,(string *)&local_118,numUnits,&local_b0,&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    paVar7 = &local_108;
    uVar6 = local_118._M_allocated_capacity;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
      uVar6 = local_118._M_allocated_capacity;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)uVar6 != paVar7) {
    operator_delete((void *)uVar6);
  }
  if (this->debugOn == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"-- COURSE CREATED --",0x14);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    std::ostream::flush();
    (*(this_00->super_CourseComponent).super_Observer._vptr_Observer[8])(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"--------------------",0x14);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    std::ostream::flush();
  }
  cVar2 = std::ios::widen((char)*(undefined8 *)(*(long *)fin + -0x18) + cVar2);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)fin,(string *)&local_1d8,cVar2);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1f8);
  if (local_178 != local_168) {
    operator_delete(local_178);
  }
  if (local_1b8 != local_1a8) {
    operator_delete(local_1b8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p);
  }
  if (local_158 != local_148) {
    operator_delete(local_158);
  }
  if (local_1d8 != local_1c8) {
    operator_delete(local_1d8);
  }
  return &this_00->super_CourseComponent;
}

Assistant:

CourseComponent* constructCourse(ifstream& fin) const {
			string courseName, courseDescription, courseTitle, prerequisites, combined;
			vector<string> prereqList;
			int units;

			getline(fin, courseName);
			getline(fin, courseTitle);
			getline(fin, prerequisites);
			getline(fin, courseDescription);
			
			if (debugOn) {
				cout << "--- FILE TEXT ---" << endl;
				cout << courseName << endl << courseTitle << endl << prerequisites << endl << courseDescription << endl;
				cout << "-----------------" << endl;
			}

			prereqList = getPrereqs(prerequisites);
			units = getCourseUnits(courseTitle);

			combined = courseTitle + "\n" + courseDescription;

			CourseComponent* course;
			if (prereqList.size() == 0) {
				course = new Prerequisite(courseName, units, combined);
			} else {
				course = new Course(courseName, units, combined, prerequisites);
			}

			if (debugOn) {
				cout << "-- COURSE CREATED --" << endl;
				course->displayCourseInfo();
				cout << "--------------------" << endl;
			}

			getline(fin, courseName); // one more time so the it skips the empty space

			return course;
		}